

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

bool __thiscall
dg::vr::ValueRelations::merge(ValueRelations *this,ValueRelations *other,Relations relations)

{
  Type TVar1;
  Handle otherH;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  HandlePtr rt;
  const_iterator cVar5;
  HandlePtr lt;
  bool bVar6;
  iterator __begin2;
  iterator __end2;
  key_type local_118;
  iterator local_110;
  _Base_bitset<1UL> local_a0;
  _Rb_tree_node_base local_98;
  size_t local_78;
  _Base_ptr local_70;
  _Rb_tree_header *local_68;
  EdgeIterator local_60;
  
  local_a0._M_w = 0x43f;
  RelationsGraph<dg::vr::ValueRelations>::begin
            (&local_110,&other->graph,(Relations *)&local_a0,true);
  local_70 = &(other->graph).buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._M_left = &local_98;
  local_98._M_color = _S_red;
  local_98._M_parent = (_Base_ptr)0x0;
  local_78 = 0;
  local_60.allowedEdges.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(_Base_bitset<1UL>)0x0;
  local_60.undirectedOnly = false;
  local_60.relationsFocused = false;
  local_60.stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = true;
  local_98._M_right = local_98._M_left;
  local_68 = (_Rb_tree_header *)local_70;
  local_60.visited._M_data =
       (set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
        *)&local_a0;
  while ((local_110.bucketIt._M_node != local_70 ||
         (bVar3 = operator==(&local_110.edgeIt,&local_60), !bVar3))) {
    pDVar2 = local_110.edgeIt.stack.
             super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    TVar1 = local_110.edgeIt.stack.
            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].current._rel;
    bVar3 = bVar6;
    if ((((ulong)relations.bits.super__Base_bitset<1UL>._M_w >> ((ulong)TVar1 & 0x3f) & 1) != 0) &&
       ((TVar1 != EQ ||
        (bVar4 = has<dg::vr::Bucket>(other,local_110.edgeIt.stack.
                                           super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                                           ._M_impl.super__Vector_impl_data._M_finish[-1].current.
                                           _to._M_data,(Relations)0x1), bVar4)))) {
      rt = getAndMerge(this,other,pDVar2[-1].current._to._M_data);
      otherH = pDVar2[-1].current._from._M_data;
      local_118._M_data = otherH;
      cVar5 = std::
              _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
              ::find(&(other->bucketToVals)._M_t,&local_118);
      lt = getCorresponding(this,other,otherH,
                            (VectorSet<const_llvm::Value_*> *)&cVar5._M_node[1]._M_parent);
      if (lt == (HandlePtr)0x0 || rt == (HandlePtr)0x0) {
        bVar3 = false;
      }
      else {
        bVar4 = RelationsGraph<dg::vr::ValueRelations>::haveConflictingRelation
                          (&this->graph,lt,pDVar2[-1].current._rel,rt,(Relations *)0x0);
        bVar3 = false;
        if (!bVar4) {
          bVar3 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                            (&this->graph,lt,pDVar2[-1].current._rel,rt,(Relations *)0x0);
          this->changed = (bool)(this->changed | bVar3);
          bVar3 = bVar6;
        }
      }
    }
    bVar6 = bVar3;
    Bucket::EdgeIterator::operator++(&local_110.edgeIt);
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::nextViableEdge(&local_110);
  }
  if (local_60.stack.
      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.stack.
                    super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.stack.
                          super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.stack.
                          super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::_M_erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
              *)&local_a0,(_Link_type)local_98._M_parent);
  if (local_110.edgeIt.stack.
      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.edgeIt.stack.
                    super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.edgeIt.stack.
                          super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.edgeIt.stack.
                          super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::_M_erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
              *)&local_110,
             (_Link_type)local_110.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar6;
}

Assistant:

bool ValueRelations::merge(const ValueRelations &other, Relations relations) {
    bool noConflict = true;
    for (const auto &edge : other.graph) {
        if (!relations.has(edge.rel()) ||
            (edge.rel() == Relations::EQ && !other.hasEqual(edge.to())))
            continue;

        HandlePtr thisToH = getAndMerge(other, edge.to());
        HandlePtr thisFromH = getCorresponding(other, edge.from());

        if (!thisToH || !thisFromH ||
            graph.haveConflictingRelation(*thisFromH, edge.rel(), *thisToH)) {
            noConflict = false;
            continue;
        }

        bool ch = graph.addRelation(*thisFromH, edge.rel(), *thisToH);
        updateChanged(ch);
    }
    return noConflict;
}